

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderDiscardCase::init(ShaderDiscardCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  uint uVar1;
  uint extraout_EAX;
  Archive *archive;
  Texture2D *pTVar2;
  Vector<float,_4> local_ec;
  Sampler local_dc;
  TextureBinding local_a0;
  bool isSupported;
  CompileFailed *anon_var_0;
  ShaderDiscardCase *local_10;
  ShaderDiscardCase *this_local;
  
  local_10 = this;
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  uVar1 = this->m_flags & 1;
  if (uVar1 != 0) {
    context = (this->super_ShaderRenderCase).m_renderCtx;
    contextInfo = (this->super_ShaderRenderCase).m_ctxInfo;
    archive = tcu::TestContext::getArchive
                        ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx);
    pTVar2 = glu::Texture2D::create(context,contextInfo,archive,"data/brick.png");
    this->m_brickTexture = pTVar2;
    pTVar2 = this->m_brickTexture;
    tcu::Vector<float,_4>::Vector(&local_ec,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (&local_dc,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,LINEAR,0.0,true,
               COMPAREMODE_NONE,0,&local_ec,false,MODE_DEPTH);
    deqp::gls::TextureBinding::TextureBinding(&local_a0,pTVar2,&local_dc);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,&local_a0);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void ShaderDiscardCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
	}
}